

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

bool __thiscall
HighsHashTree<int,_void>::InnerLeaf<3>::erase_entry
          (InnerLeaf<3> *this,uint64_t fullHash,int hashPos,int *key)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  difference_type __d_1;
  long lVar10;
  long lVar11;
  difference_type __d;
  long lVar12;
  uint16_t hash;
  int local_44;
  long local_40;
  array<unsigned_long,_39UL> *local_38;
  
  uVar9 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  hash = (uint16_t)uVar9;
  uVar3 = (uVar9 & 0xffff) >> 10;
  uVar2 = (this->occupation).occupation;
  if ((uVar2 >> uVar3 & 1) == 0) {
    return false;
  }
  lVar11 = POPCOUNT(uVar2 >> (sbyte)uVar3);
  do {
    lVar10 = lVar11;
    lVar11 = lVar10 + 1;
  } while ((ushort)uVar3 < (ushort)((ushort)(this->hashes)._M_elems[lVar10 + -1] >> 10));
  lVar12 = lVar11;
  do {
    lVar8 = lVar12 + 1;
    lVar4 = lVar12 + -2;
    lVar12 = lVar8;
  } while ((uVar9 & 0xffff) < (this->hashes)._M_elems[lVar4]);
  local_44 = (int)lVar8 + -3;
  bVar6 = find_key(this,key,&hash,&local_44);
  iVar5 = local_44;
  if (!bVar6) {
    return bVar6;
  }
  iVar1 = this->size;
  iVar7 = iVar1 + -1;
  this->size = iVar7;
  lVar12 = (long)local_44;
  if (local_44 < iVar7) {
    lVar11 = lVar12 + 1;
    local_38 = &this->hashes;
    if (iVar1 != (int)lVar11) {
      local_40 = lVar11;
      memmove((this->entries)._M_elems + lVar12,(this->entries)._M_elems + lVar12 + 1,
              (iVar1 - lVar11) * 4);
      iVar7 = this->size;
      lVar11 = local_40;
    }
    memmove(local_38->_M_elems + lVar12,local_38->_M_elems + lVar11,(long)(iVar7 - iVar5) << 3);
    if ((ushort)((ushort)(this->hashes)._M_elems[lVar10 + -1] >> 10) == (ushort)uVar3)
    goto LAB_00284846;
  }
  else if (local_44 + 2 != (int)lVar11) goto LAB_00284846;
  (this->occupation).occupation = (this->occupation).occupation ^ 1L << (sbyte)uVar3;
LAB_00284846:
  (this->hashes)._M_elems[this->size] = 0;
  return bVar6;
}

Assistant:

bool erase_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return false;

      int startPos = occupation.num_set_until(hashChunk) - 1;
      while (get_first_chunk16(hashes[startPos]) > hashChunk) ++startPos;

      int pos = startPos;
      while (hashes[pos] > hash) ++pos;

      if (!find_key(key, hash, pos)) return false;

      --size;
      if (pos < size) {
        std::move(std::next(entries.begin(), pos + 1),
                  std::next(entries.begin(), size + 1),
                  std::next(entries.begin(), pos));
        memmove(&hashes[pos], &hashes[pos + 1],
                sizeof(hashes[0]) * (size - pos));
        if (get_first_chunk16(hashes[startPos]) != hashChunk)
          occupation.flip(hashChunk);
      } else if (startPos == pos)
        occupation.flip(hashChunk);

      hashes[size] = 0;
      return true;
    }